

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

shared_ptr<const_calc4::Operator> __thiscall
calc4::Optimize<__int128>
          (calc4 *this,CompilationContext *context,shared_ptr<const_calc4::Operator> *op)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  shared_ptr<const_calc4::Operator> sVar2;
  shared_ptr<const_calc4::Operator> optimized;
  anon_unknown_23 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  OperatorImplement local_68;
  
  for (p_Var1 = (context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var1 !=
        &(context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    anon_unknown_23::OptimizeCore<__int128>
              (local_78,context,(shared_ptr<const_calc4::Operator> *)&p_Var1[3]._M_parent);
    OperatorImplement::OperatorImplement
              (&local_68,(OperatorDefinition *)(p_Var1 + 2),
               (shared_ptr<const_calc4::Operator> *)local_78);
    CompilationContext::AddOperatorImplement(context,&local_68);
    OperatorImplement::~OperatorImplement(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  }
  sVar2 = anon_unknown_23::OptimizeCore<__int128>((anon_unknown_23 *)this,context,op);
  sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_calc4::Operator>)
         sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Operator> Optimize(CompilationContext& context,
                                         const std::shared_ptr<const Operator>& op)
{
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        std::shared_ptr<const Operator> optimized =
            OptimizeCore<TNumber>(context, it->second.GetOperator());
        context.AddOperatorImplement(
            OperatorImplement(it->second.GetDefinition(), std::move(optimized)));
    }

    return OptimizeCore<TNumber>(context, op);
}